

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

Var Js::GlobalObject::VEval
              (JavascriptLibrary *library,FrameDisplay *environment,ModuleID moduleID,
              bool strictMode,bool isIndirect,Arguments *args,bool isLibraryCode,
              bool registerDocument,uint32 additionalGrfscr,ScriptContext *debugEvalScriptContext)

{
  ScriptContext *this;
  Type p_Var1;
  Utf8SourceInfo *this_00;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  charcount_t sourceLen;
  int iVar6;
  charcount_t cVar7;
  BOOL BVar8;
  uint32 bodyCtrId;
  undefined4 *puVar9;
  Var pvVar10;
  JavascriptString *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParseableFunctionInfo *pfi;
  FunctionBody *pFVar11;
  TopLevelEvalFunctionBodyResolveInfo *pTVar12;
  FunctionProxy *this_02;
  GlobalObject *this_03;
  uint uVar13;
  undefined1 local_b8 [8];
  FastEvalMapString key;
  Var varThis;
  uint local_78;
  byte local_44;
  GlobalObject *local_40;
  ScriptFunction *pfuncScript;
  
  if (library == (JavascriptLibrary *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x22b,"(library)","library");
    if (!bVar3) goto LAB_00a24f66;
    *puVar9 = 0;
  }
  this = (library->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar13 = *(uint *)&args->Info & 0xffffff;
  if (uVar13 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x230,"(argCount > 0)","Should always have implicit \'this\'");
    if (!bVar3) {
LAB_00a24f66:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  key._32_8_ = (library->super_JavascriptLibraryBase).undefinedValue.ptr;
  if (uVar13 < 2) {
    return (RecyclableObject *)key._32_8_;
  }
  pvVar10 = Arguments::operator[](args,1);
  bVar3 = VarIs<Js::JavascriptString>(pvVar10);
  if (!bVar3) {
    return pvVar10;
  }
  if (this->transitionToDebugModeIfFirstSourceFn != (TransitionToDebugModeIfFirstSourceFn)0x0) {
    (*this->transitionToDebugModeIfFirstSourceFn)(this,(Utf8SourceInfo *)0x0);
  }
  local_40 = (GlobalObject *)0x0;
  this_01 = VarTo<Js::JavascriptString>(pvVar10);
  iVar5 = (*(this_01->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(this_01);
  sourceLen = JavascriptString::GetLength(this_01);
  EvalMapStringInternal<true>::EvalMapStringInternal
            ((EvalMapStringInternal<true> *)local_b8,(FinalizableObject *)this_01,
             (char16 *)CONCAT44(extraout_var,iVar5),sourceLen,moduleID,(uint)strictMode,
             (uint)isLibraryCode);
  bVar3 = debugEvalScriptContext != (ScriptContext *)0x0 ||
          (this_01->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject ==
          (_func_int **)VirtualTableInfo<Js::PropertyString>::Address;
  local_78 = (uint)isIndirect;
  if ((bVar3) ||
     (bVar4 = ScriptContext::IsInEvalMap
                        (this,(FastEvalMapString *)local_b8,(uint)isIndirect,
                         (ScriptFunction **)&local_40), !bVar4)) {
    local_44 = 0;
  }
  else {
    if ((isIndirect) ||
       ((local_40->super_RootObjectBase).loadMethodInlineCacheMap.ptr ==
        (BaseDictionary<const_Js::PropertyRecord_*,_Js::RootObjectInlineCache_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)&NullFrameDisplay)) {
      pFVar11 = JavascriptFunction::GetFunctionBody((JavascriptFunction *)local_40);
      this_00 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
      bVar3 = ScriptContext::IsScriptContextInDebugMode(this);
      if (((bVar3) && ((this_00->field_0xa8 & 4) == 0)) &&
         (bVar3 = Utf8SourceInfo::IsInDebugMode(this_00), !bVar3)) {
        Throw::FatalInternalError(-0x7fffbffb);
      }
      goto LAB_00a24d6e;
    }
    local_44 = 1;
    local_78 = 0;
  }
  p_Var1 = ((library->super_JavascriptLibraryBase).globalObject.ptr)->EvalHelper;
  pfuncScript._7_1_ = bVar3;
  iVar6 = (*(this_01->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x65])(this_01);
  cVar7 = JavascriptString::GetLength(this_01);
  local_40 = (GlobalObject *)
             (*p_Var1)(this,(char16_t *)CONCAT44(extraout_var_00,iVar6),cVar7,moduleID,
                       (uint)isLibraryCode * 0x20000 + (additionalGrfscr >> 0x12 & 0x10) + 0x1c02 ^
                       0x10 | additionalGrfscr,L"eval code",
                       (uint)(byte)(~isLibraryCode & registerDocument),local_78,(uint)strictMode);
  if ((debugEvalScriptContext != (ScriptContext *)0x0) &&
     (BVar8 = CrossSite::NeedMarshalVar(local_40,debugEvalScriptContext), BVar8 != 0)) {
    pvVar10 = CrossSite::MarshalVar(debugEvalScriptContext,local_40,false);
    local_40 = (GlobalObject *)VarTo<Js::ScriptFunction>(pvVar10);
  }
  pfuncScript._7_1_ = pfuncScript._7_1_ | local_44;
  if (pfuncScript._7_1_ == 0) {
    ScriptContext::AddToEvalMap
              (this,(FastEvalMapString *)local_b8,local_78,(ScriptFunction *)local_40);
  }
LAB_00a24d6e:
  if ((!isLibraryCode && local_40 != (GlobalObject *)0x0) &&
     ((this->TTDRecordModeEnabled != false || (this->TTDShouldPerformReplayAction == true)))) {
    pfi = JavascriptFunction::GetParseableFunctionInfo((JavascriptFunction *)local_40);
    pFVar11 = TTD::JsSupport::ForceAndGetFunctionBody(pfi);
    bVar3 = TTD::ScriptContextTTD::IsBodyAlreadyLoadedAtTopLevel(this->TTDContextInfo,pFVar11);
    if (!bVar3) {
      bodyCtrId = 0;
      if (this->TTDRecordModeEnabled == true) {
        pTVar12 = TTD::EventLog::AddEvalFunction
                            (this->threadContext->TTDLog,pFVar11,moduleID,
                             (char16 *)CONCAT44(extraout_var,iVar5),sourceLen,additionalGrfscr,
                             registerDocument,(uint)isIndirect,(uint)strictMode);
        if (this->TTDShouldPerformRecordAction == true) {
          TTD::EventLog::RecordTopLevelCodeAction
                    (this->threadContext->TTDLog,(pTVar12->TopLevelBase).TopLevelBodyCtr);
        }
        bodyCtrId = (pTVar12->TopLevelBase).TopLevelBodyCtr;
      }
      if (this->TTDShouldPerformReplayAction == true) {
        bodyCtrId = TTD::EventLog::ReplayTopLevelCodeAction(this->threadContext->TTDLog);
      }
      TTD::ScriptContextTTD::ProcessFunctionBodyOnLoad
                (this->TTDContextInfo,pFVar11,(FunctionBody *)0x0);
      TTD::ScriptContextTTD::RegisterEvalScript(this->TTDContextInfo,pFVar11,bodyCtrId);
      if (this->TTDShouldPerformRecordOrReplayAction == true) {
        ((pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
        m_sourceInfoId = bodyCtrId;
      }
      if (this->TTDShouldPerformReplayDebuggerAction == true) {
        TTD::ExecutionInfoManager::ProcessScriptLoad
                  (this->threadContext->TTDExecutionInfo,this,bodyCtrId,pFVar11,
                   (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,
                   (CompileScriptException *)0x0);
      }
    }
  }
  if (DAT_0143bfcb == '\x01') {
    this_02 = ScriptFunction::GetFunctionProxy((ScriptFunction *)local_40);
    FunctionProxy::EnsureDeserialized(this_02);
  }
  this_03 = local_40;
  bVar3 = ScriptFunction::HasSuperReference((ScriptFunction *)local_40);
  if ((bVar3) && (((args->Info).field_0x3 & 8) == 0)) {
    JavascriptError::ThrowSyntaxError(this,-0x7ff5fbdc,L"super");
  }
  pvVar10 = ExecuteEvalParsedFunction
                      (this_03,(ScriptFunction *)local_40,environment,(Var *)&key.strict,this);
  return pvVar10;
}

Assistant:

Var GlobalObject::VEval(JavascriptLibrary* library, FrameDisplay* environment, ModuleID moduleID, bool strictMode, bool isIndirect,
        Arguments& args, bool isLibraryCode, bool registerDocument, uint32 additionalGrfscr, ScriptContext* debugEvalScriptContext)
    {
        Assert(library);
        ScriptContext* scriptContext = library->GetScriptContext();

        unsigned argCount = args.Info.Count;

        AssertMsg(argCount > 0, "Should always have implicit 'this'");

        bool doRegisterDocument = registerDocument & !isLibraryCode;
        Var varThis = library->GetUndefined();

        if (argCount < 2)
        {
            return library->GetUndefined();
        }

        Var evalArg = args[1];
        if (!VarIs<JavascriptString>(evalArg))
        {
            // "If x is not a string value, return x."
            return evalArg;
        }

#ifdef ENABLE_SCRIPT_DEBUGGING
        // It might happen that no script parsed on this context (scriptContext) till now,
        // so this Eval acts as the first source compile for scriptContext, transition to debugMode as needed
        scriptContext->TransitionToDebugModeIfFirstSource(/* utf8SourceInfo = */ nullptr);
#endif

        ScriptFunction *pfuncScript = nullptr;
        JavascriptString *argString = VarTo<JavascriptString>(evalArg);
        char16 const * sourceString = argString->GetSz();
        charcount_t sourceLen = argString->GetLength();
        FastEvalMapString key(argString, sourceString, sourceLen, moduleID, strictMode, isLibraryCode);


        // PropertyString's buffer references to PropertyRecord's inline buffer, if both PropertyString and PropertyRecord are collected
        // we'll leave the PropertyRecord's interior buffer pointer in the EvalMap. So do not use evalmap if we are evaluating PropertyString
        bool useEvalMap = !VirtualTableInfo<PropertyString>::HasVirtualTable(argString) && debugEvalScriptContext == nullptr; // Don't use the cache in case of debugEval

        bool found = useEvalMap && scriptContext->IsInEvalMap(key, isIndirect, &pfuncScript);
        if (!found || (!isIndirect && pfuncScript->GetEnvironment() != &NullFrameDisplay))
        {
            uint32 grfscr = additionalGrfscr | fscrReturnExpression | fscrEval | fscrEvalCode | fscrGlobalCode;

            if (isLibraryCode)
            {
                grfscr |= fscrIsLibraryCode;
            }

            if (!(grfscr & fscrConsoleScopeEval))
            {
                grfscr |= fscrCanDeferFncParse;
            }

            pfuncScript = library->GetGlobalObject()->EvalHelper(scriptContext, argString->GetSz(), argString->GetLength(), moduleID,
                grfscr, Constants::EvalCode, doRegisterDocument, isIndirect, strictMode);

            if (debugEvalScriptContext != nullptr && CrossSite::NeedMarshalVar(pfuncScript, debugEvalScriptContext))
            {
                // This is console scope scenario. DebugEval script context is on the top of the stack. But we are going
                // to execute the user script from target script context. In order to fix the script context stack we
                // need to marshall the function object.
                pfuncScript = VarTo<ScriptFunction>(CrossSite::MarshalVar(debugEvalScriptContext, pfuncScript));
            }

            if (useEvalMap && !found)
            {
                scriptContext->AddToEvalMap(key, isIndirect, pfuncScript);
            }
        }
#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        else
        {
            Js::Utf8SourceInfo* utf8SourceInfo = pfuncScript->GetFunctionBody()->GetUtf8SourceInfo();
            if (scriptContext->IsScriptContextInDebugMode() && !utf8SourceInfo->GetIsLibraryCode() && !utf8SourceInfo->IsInDebugMode())
            {
                // Identifying if any non library function escaped for not being in debug mode.
                Throw::FatalInternalError();
            }
        }
#endif

#if ENABLE_TTD
        //
        //TODO: We may (probably?) want to use the debugger source rundown functionality here instead
        //
        if(!isLibraryCode && pfuncScript != nullptr && (scriptContext->IsTTDRecordModeEnabled() || scriptContext->ShouldPerformReplayAction()))
        {
            //Make sure we have the body and text information available
            FunctionBody* globalBody = TTD::JsSupport::ForceAndGetFunctionBody(pfuncScript->GetParseableFunctionInfo());
            if(!scriptContext->TTDContextInfo->IsBodyAlreadyLoadedAtTopLevel(globalBody))
            {
                uint32 bodyIdCtr = 0;

                if(scriptContext->IsTTDRecordModeEnabled())
                {
                    const TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo* tbfi = scriptContext->GetThreadContext()->TTDLog->AddEvalFunction(globalBody, moduleID, sourceString, sourceLen, additionalGrfscr, registerDocument, isIndirect, strictMode);

                    //We always want to register the top-level load but we don't always need to log the event
                    if(scriptContext->ShouldPerformRecordAction())
                    {
                        scriptContext->GetThreadContext()->TTDLog->RecordTopLevelCodeAction(tbfi->TopLevelBase.TopLevelBodyCtr);
                    }

                    bodyIdCtr = tbfi->TopLevelBase.TopLevelBodyCtr;
                }

                if(scriptContext->ShouldPerformReplayAction())
                {
                    bodyIdCtr = scriptContext->GetThreadContext()->TTDLog->ReplayTopLevelCodeAction();
                }

                //walk global body to (1) add functions to pin set (2) build parent map
                scriptContext->TTDContextInfo->ProcessFunctionBodyOnLoad(globalBody, nullptr);
                scriptContext->TTDContextInfo->RegisterEvalScript(globalBody, bodyIdCtr);

                if(scriptContext->ShouldPerformRecordOrReplayAction())
                {
                    globalBody->GetUtf8SourceInfo()->SetSourceInfoForDebugReplay_TTD(bodyIdCtr);
                }

                if(scriptContext->ShouldPerformReplayDebuggerAction())
                {
                    scriptContext->GetThreadContext()->TTDExecutionInfo->ProcessScriptLoad(scriptContext, bodyIdCtr, globalBody, globalBody->GetUtf8SourceInfo(), nullptr);
                }
            }
        }
#endif

        //We shouldn't be serializing eval functions; unless with -ForceSerialized flag
        if (CONFIG_FLAG(ForceSerialized)) {
            pfuncScript->GetFunctionProxy()->EnsureDeserialized();
        }

        if (pfuncScript->HasSuperReference())
        {
            // Indirect evals cannot have a super reference.
            if (!(args.Info.Flags & CallFlags_ExtraArg))
            {
                JavascriptError::ThrowSyntaxError(scriptContext, ERRSuperInIndirectEval, _u("super"));
            }
        }

        return library->GetGlobalObject()->ExecuteEvalParsedFunction(pfuncScript, environment, varThis, scriptContext);
    }